

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

string * __thiscall
t_java_generator::get_java_type_string_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_type *type)

{
  int iVar1;
  undefined4 extraout_var;
  runtime_error *prVar2;
  undefined4 extraout_var_00;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  do {
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xe])(type);
    if ((char)iVar1 != '\0') {
      pcVar3 = "org.apache.thrift.protocol.TType.LIST";
LAB_00206eec:
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&bStack_58);
      return __return_storage_ptr__;
    }
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0x10])(type);
    if ((char)iVar1 != '\0') {
      pcVar3 = "org.apache.thrift.protocol.TType.MAP";
      goto LAB_00206eec;
    }
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xf])(type);
    if ((char)iVar1 != '\0') {
      pcVar3 = "org.apache.thrift.protocol.TType.SET";
      goto LAB_00206eec;
    }
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xb])(type);
    if (((char)iVar1 != '\0') ||
       (iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xc])(type),
       (char)iVar1 != '\0')) {
      pcVar3 = "org.apache.thrift.protocol.TType.STRUCT";
      goto LAB_00206eec;
    }
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[10])(type);
    if ((char)iVar1 != '\0') {
      pcVar3 = "org.apache.thrift.protocol.TType.ENUM";
      goto LAB_00206eec;
    }
    iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[9])(type);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[5])(type);
      if ((char)iVar1 == '\0') {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[3])(type);
        std::operator+(&local_38,"Unknown thrift type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar1));
        std::operator+(&bStack_58,&local_38,"\" passed to t_java_generator::get_java_type_string!");
        std::runtime_error::runtime_error(prVar2,(string *)&bStack_58);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      switch(*(undefined4 *)&((t_typedef *)type)->type_) {
      case 0:
        pcVar3 = "org.apache.thrift.protocol.TType.VOID";
        break;
      case 1:
        pcVar3 = "org.apache.thrift.protocol.TType.STRING";
        break;
      case 2:
        pcVar3 = "org.apache.thrift.protocol.TType.BOOL";
        break;
      case 3:
        pcVar3 = "org.apache.thrift.protocol.TType.BYTE";
        break;
      case 4:
        pcVar3 = "org.apache.thrift.protocol.TType.I16";
        break;
      case 5:
        pcVar3 = "org.apache.thrift.protocol.TType.I32";
        break;
      case 6:
        pcVar3 = "org.apache.thrift.protocol.TType.I64";
        break;
      case 7:
        pcVar3 = "org.apache.thrift.protocol.TType.DOUBLE";
        break;
      default:
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        iVar1 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[3])(type);
        std::operator+(&local_38,"Unknown thrift type \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var_00,iVar1));
        std::operator+(&bStack_58,&local_38,"\" passed to t_java_generator::get_java_type_string!");
        std::runtime_error::runtime_error(prVar2,(string *)&bStack_58);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00206eec;
    }
    type = t_typedef::get_type((t_typedef *)type);
  } while( true );
}

Assistant:

std::string t_java_generator::get_java_type_string(t_type* type) {
  if (type->is_list()) {
    return "org.apache.thrift.protocol.TType.LIST";
  } else if (type->is_map()) {
    return "org.apache.thrift.protocol.TType.MAP";
  } else if (type->is_set()) {
    return "org.apache.thrift.protocol.TType.SET";
  } else if (type->is_struct() || type->is_xception()) {
    return "org.apache.thrift.protocol.TType.STRUCT";
  } else if (type->is_enum()) {
    return "org.apache.thrift.protocol.TType.ENUM";
  } else if (type->is_typedef()) {
    return get_java_type_string(((t_typedef*)type)->get_type());
  } else if (type->is_base_type()) {
    switch (((t_base_type*)type)->get_base()) {
    case t_base_type::TYPE_VOID:
      return "org.apache.thrift.protocol.TType.VOID";
      break;
    case t_base_type::TYPE_STRING:
      return "org.apache.thrift.protocol.TType.STRING";
      break;
    case t_base_type::TYPE_BOOL:
      return "org.apache.thrift.protocol.TType.BOOL";
      break;
    case t_base_type::TYPE_I8:
      return "org.apache.thrift.protocol.TType.BYTE";
      break;
    case t_base_type::TYPE_I16:
      return "org.apache.thrift.protocol.TType.I16";
      break;
    case t_base_type::TYPE_I32:
      return "org.apache.thrift.protocol.TType.I32";
      break;
    case t_base_type::TYPE_I64:
      return "org.apache.thrift.protocol.TType.I64";
      break;
    case t_base_type::TYPE_DOUBLE:
      return "org.apache.thrift.protocol.TType.DOUBLE";
      break;
    default:
      throw std::runtime_error("Unknown thrift type \"" + type->get_name()
                               + "\" passed to t_java_generator::get_java_type_string!");
      return "Unknown thrift type \"" + type->get_name()
             + "\" passed to t_java_generator::get_java_type_string!";
      break; // This should never happen!
    }
  } else {
    throw std::runtime_error("Unknown thrift type \"" + type->get_name()
                             + "\" passed to t_java_generator::get_java_type_string!");
    // This should never happen!
  }
}